

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::info<char[13],int,char,int,char,int,char[4]>
          (ConsoleLogger *this,char (*args) [13],int *args_1,char *args_2,int *args_3,char *args_4,
          int *args_5,char (*args_6) [4])

{
  int *in_RCX;
  char (*in_RDX) [13];
  ConsoleLogger *in_RSI;
  char *in_RDI;
  char *in_R8;
  int *in_R9;
  int *unaff_retaddr;
  char (*in_stack_00000008) [4];
  mutex *in_stack_ffffffffffffffc0;
  
  if (*(int *)(in_RDI + 0x6c) < 2) {
    std::mutex::lock(in_stack_ffffffffffffffc0);
    if ((in_RDI[0x68] & 1U) != 0) {
      std::operator<<(*(ostream **)in_RDI,(string *)(in_RDI + 8));
    }
    std::operator<<(*(ostream **)in_RDI,"[i] ");
    if ((in_RDI[0x68] & 1U) != 0) {
      std::operator<<(*(ostream **)in_RDI,"\x1b[0m");
    }
    print<char[13],int,char,int,char,int,char[4]>
              (in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_RDI,unaff_retaddr,in_stack_00000008);
    std::mutex::unlock((mutex *)0x10fb98);
  }
  return;
}

Assistant:

void ConsoleLogger::info(const Args&... args)
{
	if (loglevel > 1) return;
	mtx.lock();
	if (colored) out << infoColor;
	out << "[i] ";
	if (colored) out << "\033[0m";
	print(args...);
	mtx.unlock();
}